

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

int __thiscall CVmDynFuncVMIfc::validate_pool_list(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  bVar5 = (byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_;
  uVar6 = (ulong)(ofs >> (bVar5 & 0x1f));
  iVar3 = 0;
  iVar4 = 0;
  if ((uVar6 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
     (pcVar2 = G_const_pool_X.super_CVmPoolPaged.pages_[uVar6].mem, iVar4 = 0, pcVar2 != (char *)0x0
     )) {
    uVar9 = G_const_pool_X.super_CVmPoolPaged._8_4_ - 1;
    uVar8 = (ulong)(uVar9 & ofs);
    iVar4 = iVar3;
    if (uVar8 < G_const_pool_X.super_CVmPoolPaged.pages_[uVar6].siz) {
      uVar6 = (ulong)(ofs + 1 >> (bVar5 & 0x1f));
      if (((uVar6 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
          (G_const_pool_X.super_CVmPoolPaged.pages_[uVar6].mem != (char *)0x0)) &&
         ((ulong)(ofs + 1 & uVar9) < G_const_pool_X.super_CVmPoolPaged.pages_[uVar6].siz)) {
        uVar1 = *(ushort *)(pcVar2 + uVar8);
        uVar10 = ofs + (uint)uVar1 + (uint)uVar1 * 4 + 1;
        uVar6 = (ulong)(uVar10 >> (bVar5 & 0x1f));
        if (((uVar6 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
            (G_const_pool_X.super_CVmPoolPaged.pages_[uVar6].mem != (char *)0x0)) &&
           (((ulong)(uVar9 & uVar10) < G_const_pool_X.super_CVmPoolPaged.pages_[uVar6].siz &&
            (iVar4 = 1, (ulong)uVar1 != 0)))) {
          lVar7 = 0;
          do {
            if (0x12 < (byte)pcVar2[lVar7 + uVar8 + 2]) {
              return 0;
            }
            lVar7 = lVar7 + 5;
          } while ((ulong)uVar1 * 5 != lVar7);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

virtual int validate_pool_list(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        const char *p = G_const_pool->get_ptr(ofs);
        size_t len = vmb_get_len(p);
        p += VMB_LEN;

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(
            ofs + VMB_LEN + (len*VMB_DATAHOLDER) - 1))
            return FALSE;

        /* validate that each element is valid */
        for ( ; len != 0 ; p += VMB_DATAHOLDER, --len)
        {
            if (*p < 0 || *p >= (int)VM_FIRST_INVALID_TYPE)
                return FALSE;
        }

        /* success */
        return TRUE;
    }